

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

void init_stream_properties
               (quicly_stream_t *stream,uint32_t initial_max_stream_data_local,
               uint64_t initial_max_stream_data_remote)

{
  int iVar1;
  uint uVar2;
  undefined8 in_RDX;
  uint in_ESI;
  undefined8 *in_RDI;
  uint32_t fragments_minmax;
  int is_client;
  quicly_stream_id_t in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffe0;
  
  quicly_is_client((quicly_conn_t *)*in_RDI);
  iVar1 = quicly_stream_has_send_side(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    quicly_sendstate_init_closed((quicly_sendstate_t *)0x14c108);
  }
  else {
    quicly_sendstate_init((quicly_sendstate_t *)0x14c0f8);
  }
  iVar1 = quicly_stream_has_receive_side(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  if (iVar1 == 0) {
    quicly_recvstate_init_closed((quicly_recvstate_t *)0x14c13d);
  }
  else {
    quicly_recvstate_init((quicly_recvstate_t *)0x14c12d);
  }
  *(byte *)(in_RDI + 0x17) = *(byte *)(in_RDI + 0x17) & 0xfe;
  in_RDI[0x18] = in_RDX;
  *(undefined4 *)(in_RDI + 0x19) = 0;
  *(undefined2 *)((long)in_RDI + 0xcc) = 0;
  *(undefined4 *)(in_RDI + 0x1a) = 0;
  *(undefined2 *)((long)in_RDI + 0xd4) = 0;
  quicly_maxsender_init((quicly_maxsender_t *)(in_RDI + 0x1b),(ulong)in_ESI);
  *(undefined4 *)(in_RDI + 0x1f) = 0;
  quicly_linklist_init((quicly_linklist_t *)(in_RDI + 0x20));
  quicly_linklist_init((quicly_linklist_t *)(in_RDI + 0x22));
  *(uint *)(in_RDI + 0x24) = in_ESI;
  uVar2 = (int)*(undefined8 *)(*(long *)*in_RDI + 0x50) +
          (int)*(undefined8 *)(*(long *)*in_RDI + 0x48);
  if (uVar2 < 0x3f) {
    uVar2 = 0x3f;
  }
  *(uint *)((long)in_RDI + 0x124) = in_ESI >> 10;
  if (in_ESI >> 10 < uVar2) {
    *(uint *)((long)in_RDI + 0x124) = uVar2;
  }
  return;
}

Assistant:

static void init_stream_properties(quicly_stream_t *stream, uint32_t initial_max_stream_data_local,
                                   uint64_t initial_max_stream_data_remote)
{
    int is_client = quicly_is_client(stream->conn);

    if (quicly_stream_has_send_side(is_client, stream->stream_id)) {
        quicly_sendstate_init(&stream->sendstate);
    } else {
        quicly_sendstate_init_closed(&stream->sendstate);
    }
    if (quicly_stream_has_receive_side(is_client, stream->stream_id)) {
        quicly_recvstate_init(&stream->recvstate);
    } else {
        quicly_recvstate_init_closed(&stream->recvstate);
    }
    stream->streams_blocked = 0;

    stream->_send_aux.max_stream_data = initial_max_stream_data_remote;
    stream->_send_aux.stop_sending.sender_state = QUICLY_SENDER_STATE_NONE;
    stream->_send_aux.stop_sending.error_code = 0;
    stream->_send_aux.reset_stream.sender_state = QUICLY_SENDER_STATE_NONE;
    stream->_send_aux.reset_stream.error_code = 0;
    quicly_maxsender_init(&stream->_send_aux.max_stream_data_sender, initial_max_stream_data_local);
    stream->_send_aux.blocked = QUICLY_SENDER_STATE_NONE;
    quicly_linklist_init(&stream->_send_aux.pending_link.control);
    quicly_linklist_init(&stream->_send_aux.pending_link.default_scheduler);

    stream->_recv_aux.window = initial_max_stream_data_local;

    /* Set the number of max ranges to be capable of handling following case:
     * * every one of the two packets being sent are lost
     * * average size of a STREAM frame found in a packet is >= ~512 bytes, or small STREAM frame is sent for every other stream
     *   being opened (e.g., sending QPACK encoder/decoder stream frame for each HTTP/3 request)
     * See also: the doc-comment on `_recv_aux.max_ranges`.
     */
    uint32_t fragments_minmax = (uint32_t)(stream->conn->super.ctx->transport_params.max_streams_uni +
                                           stream->conn->super.ctx->transport_params.max_streams_bidi);
    if (fragments_minmax < 63)
        fragments_minmax = 63;
    if ((stream->_recv_aux.max_ranges = initial_max_stream_data_local / 1024) < fragments_minmax)
        stream->_recv_aux.max_ranges = fragments_minmax;
}